

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

int mbedtls_mpi_add_abs(mbedtls_mpi *X,mbedtls_mpi *A,mbedtls_mpi *B)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  mbedtls_mpi *T;
  mbedtls_mpi_uint tmp;
  mbedtls_mpi_uint c;
  mbedtls_mpi_uint *p;
  mbedtls_mpi_uint *o;
  size_t j;
  size_t i;
  mbedtls_mpi *pmStack_20;
  int ret;
  mbedtls_mpi *B_local;
  mbedtls_mpi *A_local;
  mbedtls_mpi *X_local;
  
  pmStack_20 = B;
  B_local = A;
  if (X == B) {
    pmStack_20 = A;
    B_local = X;
  }
  if ((X == B_local) || (i._4_4_ = mbedtls_mpi_copy(X,B_local), i._4_4_ == 0)) {
    X->s = 1;
    for (o = (mbedtls_mpi_uint *)pmStack_20->n;
        (o != (mbedtls_mpi_uint *)0x0 && (pmStack_20->p[(long)o + -1] == 0));
        o = (mbedtls_mpi_uint *)((long)o + -1)) {
    }
    i._4_4_ = mbedtls_mpi_grow(X,(size_t)o);
    if (i._4_4_ == 0) {
      p = pmStack_20->p;
      c = (mbedtls_mpi_uint)X->p;
      tmp = 0;
      for (j = 0; j < o; j = j + 1) {
        uVar1 = *p;
        *(mbedtls_mpi_uint *)c = tmp + *(long *)c;
        uVar2 = *(ulong *)c;
        *(ulong *)c = uVar1 + *(long *)c;
        tmp = (long)(int)(uint)(*(ulong *)c < uVar1) + (long)(int)(uint)(uVar2 < tmp);
        p = p + 1;
        c = c + 8;
      }
      for (; tmp != 0; tmp = (mbedtls_mpi_uint)(int)(uint)(uVar1 < tmp)) {
        if (X->n <= j) {
          iVar3 = mbedtls_mpi_grow(X,j + 1);
          if (iVar3 != 0) {
            return iVar3;
          }
          c = (mbedtls_mpi_uint)(X->p + j);
          i._4_4_ = 0;
        }
        *(mbedtls_mpi_uint *)c = tmp + *(long *)c;
        uVar1 = *(ulong *)c;
        j = j + 1;
        c = c + 8;
      }
    }
  }
  return i._4_4_;
}

Assistant:

int mbedtls_mpi_add_abs( mbedtls_mpi *X, const mbedtls_mpi *A, const mbedtls_mpi *B )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t i, j;
    mbedtls_mpi_uint *o, *p, c, tmp;
    MPI_VALIDATE_RET( X != NULL );
    MPI_VALIDATE_RET( A != NULL );
    MPI_VALIDATE_RET( B != NULL );

    if( X == B )
    {
        const mbedtls_mpi *T = A; A = X; B = T;
    }

    if( X != A )
        MBEDTLS_MPI_CHK( mbedtls_mpi_copy( X, A ) );

    /*
     * X should always be positive as a result of unsigned additions.
     */
    X->s = 1;

    for( j = B->n; j > 0; j-- )
        if( B->p[j - 1] != 0 )
            break;

    MBEDTLS_MPI_CHK( mbedtls_mpi_grow( X, j ) );

    o = B->p; p = X->p; c = 0;

    /*
     * tmp is used because it might happen that p == o
     */
    for( i = 0; i < j; i++, o++, p++ )
    {
        tmp= *o;
        *p +=  c; c  = ( *p <  c );
        *p += tmp; c += ( *p < tmp );
    }

    while( c != 0 )
    {
        if( i >= X->n )
        {
            MBEDTLS_MPI_CHK( mbedtls_mpi_grow( X, i + 1 ) );
            p = X->p + i;
        }

        *p += c; c = ( *p < c ); i++; p++;
    }

cleanup:

    return( ret );
}